

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

pair<unsigned_long,_int> mxx::max_element<unsigned_long>(unsigned_long *x,comm *comm)

{
  pair<unsigned_long,_int> pVar1;
  pair<unsigned_long,_int> pVar2;
  int local_3c;
  unsigned_long local_38;
  pair<unsigned_long,_int> in;
  comm *comm_local;
  unsigned_long *x_local;
  
  in._8_8_ = comm;
  local_3c = mxx::comm::rank(comm);
  pVar1 = std::make_pair<unsigned_long_const&,int>(x,&local_3c);
  local_38 = pVar1.first;
  in.first._0_4_ = pVar1.second;
  pVar1 = allreduce<std::pair<unsigned_long,int>,mxx::max_element<unsigned_long>(unsigned_long_const&,mxx::comm_const&)::_lambda(std::pair<unsigned_long,int>const&,std::pair<unsigned_long,int>const&)_1_>
                    (&local_38,in._8_8_);
  pVar2._12_4_ = 0;
  pVar2.first = SUB128(pVar1._0_12_,0);
  pVar2.second = SUB124(pVar1._0_12_,8);
  return pVar2;
}

Assistant:

inline std::pair<T, int> max_element(const T& x, const mxx::comm& comm = mxx::comm()) {
    if (mxx::is_builtin_pair_type<T>::value) {
        MPI_Datatype dt = mxx::datatype_pair<T>::get_type();
        struct {
            T value;
            int rank;
        } in, out;
        in.value = x;
        in.rank = comm.rank();
        MPI_Allreduce(&in, &out, 1, dt, MPI_MAXLOC, comm);
        return std::make_pair(out.value, out.rank);
    } else {
        // use custom operator
        std::pair<T, int> in = std::make_pair(x, comm.rank());
        return mxx::allreduce(in, [](const std::pair<T, int>& x, const std::pair<T, int>& y) { return x.first < y.first ? y : x;}, comm);
    }
}